

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ImportModuleNamespaces(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  SmallArray<NamespaceData_*,_128U> *this;
  ByteCode *code;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ExternNamespaceInfo *pEVar4;
  size_t sVar5;
  NamespaceData **ppNVar6;
  undefined4 extraout_var;
  uint k;
  _func_int **__s;
  SmallArray<NamespaceData_*,_2U> *this_00;
  ulong uVar7;
  uint index;
  NamespaceData *pNVar8;
  char *__s_00;
  InplaceStr name;
  NamespaceData *ns;
  TraceScope traceScope;
  NamespaceData *local_d0;
  NamespaceData *local_c0;
  SmallArray<NamespaceData_*,_2U> *local_b8;
  ByteCode *local_b0;
  Allocator *local_a8;
  ScopeData *local_a0;
  NamespaceData *local_98;
  TraceScope local_90;
  undefined1 local_80 [80];
  
  if ((ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)
                                   ::token), iVar2 != 0)) {
    ImportModuleNamespaces::token = NULLC::TraceGetToken("analyze","ImportModuleNamespaces");
    __cxa_guard_release(&ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_90,ImportModuleNamespaces::token);
  code = moduleCtx->data->bytecode;
  pcVar3 = FindSymbols(code);
  pEVar4 = FindFirstNamespace(code);
  this = &ctx->namespaces;
  local_b8 = &ctx->globalNamespaces;
  uVar7 = 0;
  local_b0 = code;
  do {
    if (local_b0->namespaceCount <= uVar7) {
      NULLC::TraceScope::~TraceScope(&local_90);
      return;
    }
    __s = (_func_int **)(pcVar3 + pEVar4[uVar7].offsetToName);
    local_80._0_8_ = __s;
    sVar5 = strlen((char *)__s);
    local_80._8_8_ = sVar5 + (long)__s;
    uVar1 = InplaceStr::hash((InplaceStr *)local_80);
    for (index = 0; index < (ctx->namespaces).count; index = index + 1) {
      ppNVar6 = SmallArray<NamespaceData_*,_128U>::operator[](this,index);
      if ((*ppNVar6)->nameHash == uVar1) {
        ppNVar6 = SmallArray<NamespaceData_*,_128U>::operator[](this,index);
        pNVar8 = *ppNVar6;
        goto LAB_001764ba;
      }
    }
    pNVar8 = (NamespaceData *)0x0;
LAB_001764ba:
    if (pEVar4[uVar7].parentHash == 0xffffffff) {
      local_d0 = (NamespaceData *)0x0;
    }
    else {
      uVar1 = 0;
      while( true ) {
        if ((ctx->namespaces).count <= uVar1) goto LAB_0017660e;
        ppNVar6 = SmallArray<NamespaceData_*,_128U>::operator[](this,uVar1);
        if ((*ppNVar6)->nameHash == pEVar4[uVar7].parentHash) break;
        uVar1 = uVar1 + 1;
      }
      ppNVar6 = SmallArray<NamespaceData_*,_128U>::operator[](this,uVar1);
      local_d0 = *ppNVar6;
      if (local_d0 == (NamespaceData *)0x0) {
LAB_0017660e:
        anon_unknown.dwarf_b837c::Stop
                  (ctx,source,"ERROR: namespace %s parent not found",
                   pcVar3 + pEVar4[uVar7].offsetToName);
      }
    }
    if ((pNVar8 == (NamespaceData *)0x0) || (pNVar8->parent != local_d0)) {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
      local_98 = (NamespaceData *)CONCAT44(extraout_var,iVar2);
      local_a8 = ctx->allocator;
      local_a0 = ctx->scope;
      __s_00 = pcVar3 + pEVar4[uVar7].offsetToName;
      sVar5 = strlen(__s_00);
      name.end = __s_00 + sVar5;
      name.begin = __s_00;
      SynIdentifier::SynIdentifier((SynIdentifier *)local_80,name);
      pNVar8 = local_98;
      uVar1 = ctx->uniqueNamespaceId;
      ctx->uniqueNamespaceId = uVar1 + 1;
      NamespaceData::NamespaceData
                (local_98,local_a8,source,local_a0,local_d0,(SynIdentifier *)local_80,uVar1);
      local_c0 = pNVar8;
      this_00 = &local_d0->children;
      if (local_d0 == (NamespaceData *)0x0) {
        this_00 = local_b8;
      }
      SmallArray<NamespaceData_*,_2U>::push_back(this_00,&local_c0);
      SmallArray<NamespaceData_*,_128U>::push_back(this,&local_c0);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void ImportModuleNamespaces(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleNamespaces");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import namespaces
	ExternNamespaceInfo *namespaceList = FindFirstNamespace(bCode);

	for(unsigned i = 0; i < bCode->namespaceCount; i++)
	{
		ExternNamespaceInfo &namespaceData = namespaceList[i];

		unsigned nameHash = InplaceStr(symbols + namespaceData.offsetToName).hash();

		NamespaceData *prev = NULL;

		for(unsigned k = 0; k < ctx.namespaces.size(); k++)
		{
			if(ctx.namespaces[k]->nameHash == nameHash)
			{
				prev = ctx.namespaces[k];
				break;
			}
		}

		NamespaceData *parent = NULL;

		if(namespaceData.parentHash != ~0u)
		{
			for(unsigned k = 0; k < ctx.namespaces.size(); k++)
			{
				if(ctx.namespaces[k]->nameHash == namespaceData.parentHash)
				{
					parent = ctx.namespaces[k];
					break;
				}
			}

			if(!parent)
				Stop(ctx, source, "ERROR: namespace %s parent not found", symbols + namespaceData.offsetToName);
		}

		if(prev && prev->parent == parent)
			continue;

		NamespaceData *ns = new (ctx.get<NamespaceData>()) NamespaceData(ctx.allocator, source, ctx.scope, parent, SynIdentifier(InplaceStr(symbols + namespaceData.offsetToName)), ctx.uniqueNamespaceId++);

		if(parent)
			parent->children.push_back(ns);
		else
			ctx.globalNamespaces.push_back(ns);

		ctx.namespaces.push_back(ns);
	}
}